

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Environment.cpp
# Opt level: O2

void f8n::env::OpenFile(string *path)

{
  string command;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  std::operator+(&local_28,"xdg-open \'",path);
  std::operator+(&local_48,&local_28,"\' > /dev/null 2> /dev/null");
  std::__cxx11::string::~string((string *)&local_28);
  system(local_48._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void OpenFile(const std::string& path) {
    #ifdef WIN32
        ShellExecuteA(nullptr, nullptr, path.c_str(), nullptr, nullptr, SW_SHOWNORMAL);
    #elif __APPLE__
        std::string command = "open '" + path + "' > /dev/null 2> /dev/null";
        system(command.c_str());
    #else
        std::string command = "xdg-open '" + path + "' > /dev/null 2> /dev/null";
        system(command.c_str());
    #endif
    }